

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O0

void Am_Animation_Abort_Do_proc(Am_Object *inter)

{
  Am_Value *in_value;
  Am_Value local_48;
  undefined1 local_38 [8];
  Am_Value value;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *inter_local;
  
  local_10 = inter;
  Am_Object::Am_Object(&local_18,inter);
  Am_Stop_Timer(&local_18,0xe8);
  Am_Object::~Am_Object(&local_18);
  Am_Value::Am_Value((Am_Value *)local_38);
  in_value = Am_Object::Peek(inter,0xc5,0);
  Am_Value::operator=((Am_Value *)local_38,in_value);
  Am_Value::Am_Value(&local_48,(Am_Value *)local_38);
  call_all_commands(&local_48,0xc9,inter,&Am_No_Time,true);
  Am_Value::~Am_Value(&local_48);
  Am_Value::~Am_Value((Am_Value *)local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animation_Abort_Do,
                 (Am_Object inter))
{
  Am_Stop_Timer(inter, Am_ANIMATION_METHOD);
  Am_Value value;
  value = inter.Peek(Am_COMMAND);
  call_all_commands(value, Am_ABORT_DO_METHOD, inter, Am_No_Time, true);
}